

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O1

CECorrections * __thiscall CECorrections::LoadFile(CECorrections *this,string *filename,string *url)

{
  char cVar1;
  exception *this_00;
  string *url_00;
  
  std::ifstream::ifstream(this,(string *)url,_S_in);
  cVar1 = std::ifstream::is_open();
  if (cVar1 != '\0') {
    return this;
  }
  std::ifstream::close();
  DownloadTable(this,url,url_00);
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

std::ifstream CECorrections::LoadFile(const std::string& filename,
                                      const std::string& url) const
{
    // Check if the file has been stored
    std::ifstream corrections_file(filename, std::ios::in);

    // Try downloading the file
    if (!corrections_file.is_open()) {
        // Close the file so there's no funny business while attempting
        // to write to it
        corrections_file.close();

        // Try downloading the correction files
        if (!DownloadTable(filename, url)) {
            throw CEException::exception();
        }

        // Try to open the file again
        corrections_file.open(filename, std::ios::in);

        // Make sure the file is open
        if (!corrections_file.is_open()) {
            std::string msg = "Unable to load corrections file: " + filename;
            throw CEException::corr_file_load_error(__func__, msg);
        }
    }

    return corrections_file;
}